

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall Function::Function(Function *this,Function *f)

{
  EVP_PKEY_CTX *src;
  Function *f_local;
  Function *this_local;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0018f008;
  std::vector<Function_*,_std::allocator<Function_*>_>::vector(&this->vParents);
  std::__cxx11::string::string((string *)&this->sName);
  copy(this,(EVP_PKEY_CTX *)f,src);
  return;
}

Assistant:

Function::Function( const Function &f )
{
	copy(f);
}